

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  SerialArena *arena;
  CleanupNode *pCVar2;
  CleanupNode *pCVar3;
  long in_FS_OFFSET;
  
  if (*(uint64_t *)(in_FS_OFFSET + -0x78) != this->tag_and_id_) goto LAB_001484f8;
  arena = *(SerialArena **)(in_FS_OFFSET + -0x70);
  while( true ) {
    pCVar2 = (arena->cleanup_list_).next_;
    if (pCVar2 < (arena->cleanup_list_).limit_) {
      (arena->cleanup_list_).next_ = pCVar2 + 1;
      pCVar2->elem = elem;
      pCVar2->destructor = cleanup;
    }
    else {
      internal::cleanup::ChunkList::AddFallback(&arena->cleanup_list_,elem,cleanup,arena);
    }
    pCVar2 = (CleanupNode *)(arena->cleanup_list_).prefetch_ptr_;
    if ((pCVar2 == (CleanupNode *)0x0) || ((CleanupNode *)(arena->cleanup_list_).head_ <= pCVar2))
    break;
    this = (ThreadSafeArena *)&stack0xffffffffffffffd8;
    AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
LAB_001484f8:
    arena = GetSerialArenaFallback(this,0x10);
  }
  pCVar1 = (arena->cleanup_list_).next_;
  if (((long)pCVar2 - (long)pCVar1 < 0x181) &&
     (pCVar3 = (arena->cleanup_list_).limit_, pCVar2 < pCVar3)) {
    if (pCVar1 < pCVar2) {
      pCVar1 = pCVar2;
    }
    pCVar2 = pCVar1;
    if (pCVar2 == (CleanupNode *)0x0) {
      AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
    }
    if (pCVar2 + 0x18 < pCVar3) {
      pCVar3 = pCVar2 + 0x18;
    }
    for (; pCVar2 < pCVar3; pCVar2 = pCVar2 + 4) {
    }
  }
  (arena->cleanup_list_).prefetch_ptr_ = (char *)pCVar2;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}